

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfa.cc
# Opt level: O2

Thread * __thiscall re2::NFA::AllocThread(NFA *this)

{
  Thread *pTVar1;
  char **ppcVar2;
  ulong uVar3;
  
  pTVar1 = this->free_threads_;
  if (pTVar1 == (Thread *)0x0) {
    pTVar1 = (Thread *)operator_new(0x10);
    (pTVar1->field_0).ref = 1;
    uVar3 = 0xffffffffffffffff;
    if (-1 < (long)this->ncapture_) {
      uVar3 = (long)this->ncapture_ * 8;
    }
    ppcVar2 = (char **)operator_new__(uVar3);
    pTVar1->capture = ppcVar2;
  }
  else {
    this->free_threads_ = (Thread *)pTVar1->field_0;
    (pTVar1->field_0).ref = 1;
  }
  return pTVar1;
}

Assistant:

NFA::Thread* NFA::AllocThread() {
  Thread* t = free_threads_;
  if (t == NULL) {
    t = new Thread;
    t->ref = 1;
    t->capture = new const char*[ncapture_];
    return t;
  }
  free_threads_ = t->next;
  t->ref = 1;
  return t;
}